

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::manifestStream_abi_cxx11_
          (Interpreter *this,bool string)

{
  HeapThunk *pHVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  byte bVar3;
  bool bVar4;
  ostream *poVar5;
  undefined8 uVar6;
  reference ppHVar7;
  Frame *pFVar8;
  byte in_DL;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  UString element;
  LocationRange tloc;
  HeapThunk *thunk;
  iterator __end3;
  iterator __begin3;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *__range3;
  HeapArray *arr;
  stringstream ss;
  LocationRange loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  uint in_stack_000032a4;
  AST *in_stack_000032a8;
  Interpreter *in_stack_000032b0;
  LocationRange *in_stack_fffffffffffffc18;
  LocationRange *in_stack_fffffffffffffc20;
  Interpreter *in_stack_fffffffffffffc28;
  AST *in_stack_fffffffffffffc30;
  UString *in_stack_fffffffffffffc38;
  LocationRange *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc50;
  allocator<char32_t> *__a;
  char32_t *in_stack_fffffffffffffc58;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc60;
  string local_360 [37];
  byte local_33b;
  byte local_33a;
  BindingFrame *in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcf4;
  HeapObject *in_stack_fffffffffffffcf8;
  HeapEntity *in_stack_fffffffffffffd00;
  LocationRange *in_stack_fffffffffffffd08;
  Stack *in_stack_fffffffffffffd10;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_278;
  long local_270;
  long local_268;
  undefined1 local_259;
  string local_238 [32];
  stringstream local_218 [16];
  ostream local_208 [40];
  LocationRange *in_stack_fffffffffffffe20;
  Interpreter *in_stack_fffffffffffffe28;
  allocator<char> local_79;
  string local_78 [32];
  allocator<char32_t> local_58 [40];
  UString *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  LocationRange *in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 uVar9;
  
  bVar3 = in_DL & 1;
  uVar9 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x226099);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  LocationRange::LocationRange(in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  if (*(int *)(in_RSI + 0x40) == 0x10) {
    local_268 = *(long *)(in_RSI + 0x48);
    local_270 = local_268 + 0x10;
    local_278._M_current =
         (HeapThunk **)
         std::
         vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
         ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                  *)in_stack_fffffffffffffc18);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)in_stack_fffffffffffffc18);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                               *)in_stack_fffffffffffffc20,
                              (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                               *)in_stack_fffffffffffffc18), bVar4) {
      ppHVar7 = __gnu_cxx::
                __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator*(&local_278);
      pHVar1 = *ppHVar7;
      if (pHVar1->body == (AST *)0x0) {
        __a = local_58;
      }
      else {
        __a = (allocator<char32_t> *)&pHVar1->body->location;
      }
      LocationRange::LocationRange(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (((pHVar1->super_HeapEntity).field_0xa & 1) == 0) {
        anon_unknown_0::Stack::newCall
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffce8);
        pFVar8 = anon_unknown_0::Stack::top((Stack *)0x226528);
        aVar2 = *(anon_union_8_3_4e909c26_for_v *)(in_RSI + 0x48);
        *(undefined8 *)&pFVar8->val = *(undefined8 *)(in_RSI + 0x40);
        (pFVar8->val).v = aVar2;
        in_stack_fffffffffffffc30 = pHVar1->body;
        anon_unknown_0::Stack::size((Stack *)0x226550);
        anon_unknown_0::Interpreter::evaluate(in_stack_000032b0,in_stack_000032a8,in_stack_000032a4)
        ;
      }
      else {
        in_stack_fffffffffffffc38 = (UString *)(in_RSI + 0x50);
        in_stack_fffffffffffffd08 = (LocationRange *)0x0;
        in_stack_fffffffffffffd10 = (Stack *)0x0;
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               *)0x22644c);
        anon_unknown_0::Stack::newCall
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffce8);
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                *)0x22647d);
        pFVar8 = anon_unknown_0::Stack::top((Stack *)0x22648b);
        *(undefined8 *)&pFVar8->val = *(undefined8 *)(in_RSI + 0x40);
        (pFVar8->val).v = *(anon_union_8_3_4e909c26_for_v *)(in_RSI + 0x48);
        *(undefined8 *)(in_RSI + 0x40) = *(undefined8 *)&pHVar1->content;
        *(anon_union_8_3_4e909c26_for_v *)(in_RSI + 0x48) = (pHVar1->content).v;
      }
      local_33a = 0;
      local_33b = 0;
      if ((bVar3 & 1) == 0) {
        in_stack_fffffffffffffc20 = (LocationRange *)&stack0xfffffffffffffcc7;
        std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2265c9);
        local_33a = 1;
        std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,__a);
        local_33b = 1;
        anon_unknown_0::Interpreter::manifestJson
                  ((Interpreter *)CONCAT17(bVar3,CONCAT16(uVar9,in_stack_ffffffffffffffe8)),
                   in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                   in_stack_ffffffffffffffd0);
      }
      else {
        manifestString_abi_cxx11_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      }
      if ((local_33b & 1) != 0) {
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffffc20);
      }
      if ((local_33a & 1) != 0) {
        std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x226651);
      }
      in_stack_fffffffffffffc18 = (LocationRange *)(in_RSI + 0x50);
      pFVar8 = anon_unknown_0::Stack::top((Stack *)0x226663);
      aVar2 = (pFVar8->val).v;
      *(undefined8 *)(in_RSI + 0x40) = *(undefined8 *)&pFVar8->val;
      *(anon_union_8_3_4e909c26_for_v *)(in_RSI + 0x48) = aVar2;
      anon_unknown_0::Stack::pop((Stack *)in_stack_fffffffffffffc20);
      encode_utf8(in_stack_fffffffffffffc38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->file);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffc20);
      LocationRange::~LocationRange((LocationRange *)0x2266ce);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::operator++(&local_278);
    }
    bVar3 = 1;
    LocationRange::~LocationRange((LocationRange *)0x2267a8);
    if ((bVar3 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc30);
    }
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_218);
  poVar5 = std::operator<<(local_208,"stream mode: top-level object was a ");
  type_str_abi_cxx11_((Type)((ulong)poVar5 >> 0x20));
  poVar5 = std::operator<<(poVar5,local_238);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"should be an array whose elements hold ");
  std::operator<<(poVar5,"the JSON for each document in the stream.");
  std::__cxx11::string::~string(local_238);
  local_259 = 1;
  uVar6 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  anon_unknown_0::Interpreter::makeError
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->file);
  local_259 = 0;
  __cxa_throw(uVar6,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::vector<std::string> manifestStream(bool string)
    {
        std::vector<std::string> r;
        LocationRange loc("During manifestation");
        if (scratch.t != Value::ARRAY) {
            std::stringstream ss;
            ss << "stream mode: top-level object was a " << type_str(scratch.t) << ", "
               << "should be an array whose elements hold "
               << "the JSON for each document in the stream.";
            throw makeError(loc, ss.str());
        }
        auto *arr = static_cast<HeapArray *>(scratch.v.h);
        for (auto *thunk : arr->elements) {
            LocationRange tloc = thunk->body == nullptr ? loc : thunk->body->location;
            if (thunk->filled) {
                stack.newCall(loc, thunk, nullptr, 0, BindingFrame{});
                // Keep arr alive when scratch is overwritten
                stack.top().val = scratch;
                scratch = thunk->content;
            } else {
                stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
                // Keep arr alive when scratch is overwritten
                stack.top().val = scratch;
                evaluate(thunk->body, stack.size());
            }
            UString element = string ? manifestString(tloc) : manifestJson(tloc, true, U"");
            scratch = stack.top().val;
            stack.pop();
            r.push_back(encode_utf8(element));
        }
        return r;
    }